

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O0

FT_Error cff_ps_get_font_info(CFF_Face face,PS_FontInfoRec *afont_info)

{
  CFF_Font_conflict pCVar1;
  PS_FontInfoRec *pPVar2;
  FT_String *pFVar3;
  FT_Memory memory;
  PS_FontInfoRec *font_info;
  CFF_FontRecDict dict;
  CFF_Font_conflict pCStack_20;
  FT_Error error;
  CFF_Font_conflict cff;
  PS_FontInfoRec *afont_info_local;
  CFF_Face face_local;
  
  pCVar1 = (CFF_Font_conflict)(face->extra).data;
  dict._4_4_ = 0;
  pCStack_20 = pCVar1;
  cff = (CFF_Font_conflict)afont_info;
  afont_info_local = (PS_FontInfoRec *)face;
  if ((pCVar1 != (CFF_Font_conflict)0x0) && (pCVar1->font_info == (PS_FontInfoRec *)0x0)) {
    pPVar2 = (PS_FontInfoRec *)ft_mem_alloc((face->root).memory,0x38,(FT_Error *)((long)&dict + 4));
    if (dict._4_4_ != 0) {
      return dict._4_4_;
    }
    pFVar3 = cff_index_get_sid_string(pCStack_20,(pCVar1->top_font).font_dict.version);
    pPVar2->version = pFVar3;
    pFVar3 = cff_index_get_sid_string(pCStack_20,(pCVar1->top_font).font_dict.notice);
    pPVar2->notice = pFVar3;
    pFVar3 = cff_index_get_sid_string(pCStack_20,(pCVar1->top_font).font_dict.full_name);
    pPVar2->full_name = pFVar3;
    pFVar3 = cff_index_get_sid_string(pCStack_20,(pCVar1->top_font).font_dict.family_name);
    pPVar2->family_name = pFVar3;
    pFVar3 = cff_index_get_sid_string(pCStack_20,(pCVar1->top_font).font_dict.weight);
    pPVar2->weight = pFVar3;
    pPVar2->italic_angle = (pCVar1->top_font).font_dict.italic_angle;
    pPVar2->is_fixed_pitch = (pCVar1->top_font).font_dict.is_fixed_pitch;
    pPVar2->underline_position = (FT_Short)(pCVar1->top_font).font_dict.underline_position;
    pPVar2->underline_thickness = (FT_UShort)(pCVar1->top_font).font_dict.underline_thickness;
    pCStack_20->font_info = pPVar2;
  }
  if (pCStack_20 != (CFF_Font_conflict)0x0) {
    memcpy(cff,pCStack_20->font_info,0x38);
  }
  return dict._4_4_;
}

Assistant:

static FT_Error
  cff_ps_get_font_info( CFF_Face         face,
                        PS_FontInfoRec*  afont_info )
  {
    CFF_Font  cff   = (CFF_Font)face->extra.data;
    FT_Error  error = FT_Err_Ok;


    if ( cff && !cff->font_info )
    {
      CFF_FontRecDict  dict      = &cff->top_font.font_dict;
      PS_FontInfoRec  *font_info = NULL;
      FT_Memory        memory    = face->root.memory;


      if ( FT_ALLOC( font_info, sizeof ( *font_info ) ) )
        goto Fail;

      font_info->version     = cff_index_get_sid_string( cff,
                                                         dict->version );
      font_info->notice      = cff_index_get_sid_string( cff,
                                                         dict->notice );
      font_info->full_name   = cff_index_get_sid_string( cff,
                                                         dict->full_name );
      font_info->family_name = cff_index_get_sid_string( cff,
                                                         dict->family_name );
      font_info->weight      = cff_index_get_sid_string( cff,
                                                         dict->weight );
      font_info->italic_angle        = dict->italic_angle;
      font_info->is_fixed_pitch      = dict->is_fixed_pitch;
      font_info->underline_position  = (FT_Short)dict->underline_position;
      font_info->underline_thickness = (FT_UShort)dict->underline_thickness;

      cff->font_info = font_info;
    }

    if ( cff )
      *afont_info = *cff->font_info;

  Fail:
    return error;
  }